

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

void ctemplate::CreateOrCleanTestDirAndSetAsTmpdir(string *dirname)

{
  CreateOrCleanTestDir(dirname);
  if (g_tmpdir != (char *)0x0) {
    operator_delete__(g_tmpdir);
  }
  g_tmpdir = (char *)operator_new__(dirname->_M_string_length + 1);
  strcpy(g_tmpdir,(dirname->_M_dataplus)._M_p);
  return;
}

Assistant:

void CreateOrCleanTestDirAndSetAsTmpdir(const string& dirname) {
  CreateOrCleanTestDir(dirname);
  delete[] g_tmpdir;
  g_tmpdir = new char[dirname.length() + 1];
  strcpy(g_tmpdir, dirname.c_str());
}